

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::TexLookup::TexLookup(TexLookup *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> first;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> last;
  Type TVar1;
  int iVar2;
  ShaderParameters *pSVar3;
  Random *pRVar4;
  VariableManager *pVVar5;
  Variable *pVVar6;
  ValueEntry *this_00;
  bool local_187;
  bool local_186;
  bool local_185;
  IsSamplerEntry local_10c;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> local_108;
  IsSamplerEntry local_ec;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> local_e8;
  VariableType local_d0;
  Variable *local_80;
  Variable *sampler;
  bool allocSampler;
  bool hasSampler;
  int iStack_70;
  bool canAllocSampler;
  int samplerCubeCount;
  int sampler2DCount;
  Type samplerType;
  __normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
  local_60;
  value_type local_58 [6];
  undefined1 local_40 [8];
  vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> typeCandidates;
  GeneratorState *state_local;
  TexLookup *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_015ce490;
  this->m_type = TYPE_LAST;
  this->m_coordExpr = (Expression *)0x0;
  this->m_lodBiasExpr = (Expression *)0x0;
  VariableType::VariableType(&this->m_valueType,TYPE_FLOAT,4);
  ValueStorage<64>::ValueStorage(&this->m_value,&this->m_valueType);
  std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::vector
            ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40);
  pSVar3 = GeneratorState::getShaderParameters(state);
  if ((pSVar3->useTexture2D & 1U) != 0) {
    local_58[5] = 0;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58 + 5);
    local_58[4] = 1;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58 + 4);
    local_58[3] = 2;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58 + 3);
    local_58[2] = 3;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58 + 2);
  }
  pSVar3 = GeneratorState::getShaderParameters(state);
  if ((pSVar3->useTextureCube & 1U) != 0) {
    local_58[1] = 4;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58 + 1);
    local_58[0] = TYPE_TEXTURECUBE_LOD;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::push_back
              ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40,
               local_58);
  }
  pRVar4 = GeneratorState::getRandom(state);
  local_60._M_current =
       (Type *)std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::begin
                         ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)
                          local_40);
  _sampler2DCount =
       std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::end
                 ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40);
  TVar1 = de::Random::
          choose<rsg::TexLookup::Type,__gnu_cxx::__normal_iterator<rsg::TexLookup::Type*,std::vector<rsg::TexLookup::Type,std::allocator<rsg::TexLookup::Type>>>>
                    (pRVar4,local_60,
                     (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
                      )_sampler2DCount);
  this->m_type = TVar1;
  samplerCubeCount = 8;
  if (this->m_type < TYPE_TEXTURECUBE) {
    samplerCubeCount = 6;
  }
  else if (this->m_type - TYPE_TEXTURECUBE < 2) {
    samplerCubeCount = 7;
  }
  pVVar5 = GeneratorState::getVariableManager(state);
  iStack_70 = countSamplers(pVVar5,TYPE_SAMPLER_2D);
  pVVar5 = GeneratorState::getVariableManager(state);
  sampler._4_4_ = countSamplers(pVVar5,TYPE_SAMPLER_CUBE);
  iVar2 = iStack_70 + sampler._4_4_;
  pSVar3 = GeneratorState::getShaderParameters(state);
  sampler._3_1_ = iVar2 < pSVar3->maxSamplers;
  iVar2 = sampler._4_4_;
  if (samplerCubeCount == 6) {
    iVar2 = iStack_70;
  }
  local_185 = 0 < iVar2;
  sampler._2_1_ = local_185;
  local_186 = true;
  if (local_185) {
    local_187 = false;
    if ((bool)sampler._3_1_) {
      pRVar4 = GeneratorState::getRandom(state);
      local_187 = de::Random::getBool(pRVar4);
    }
    local_186 = local_187;
  }
  sampler._1_1_ = local_186;
  if (local_186 == false) {
    pRVar4 = GeneratorState::getRandom(state);
    pVVar5 = GeneratorState::getVariableManager(state);
    anon_unknown_0::IsSamplerEntry::IsSamplerEntry(&local_ec,samplerCubeCount);
    VariableManager::getBegin<rsg::(anonymous_namespace)::IsSamplerEntry>(&local_e8,pVVar5,local_ec)
    ;
    pVVar5 = GeneratorState::getVariableManager(state);
    anon_unknown_0::IsSamplerEntry::IsSamplerEntry(&local_10c,samplerCubeCount);
    VariableManager::getEnd<rsg::(anonymous_namespace)::IsSamplerEntry>(&local_108,pVVar5,local_10c)
    ;
    first.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_end._M_current =
         local_e8.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_end._M_current;
    first.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_iter._M_current =
         local_e8.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_iter._M_current;
    first.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_filter.m_type =
         local_e8.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_filter.m_type;
    first.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    ._20_4_ = local_e8.
              super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
              ._20_4_;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_end._M_current =
         local_108.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_end._M_current;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_iter._M_current =
         local_108.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_iter._M_current;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    .m_filter.m_type =
         local_108.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_filter.m_type;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
    ._20_4_ = local_108.
              super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
              ._20_4_;
    this_00 = de::Random::
              choose<rsg::ValueEntry_const*,rsg::ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry>>
                        (pRVar4,first,last);
    pVVar6 = ValueEntry::getVariable(this_00);
    this->m_sampler = pVVar6;
  }
  else {
    pVVar5 = GeneratorState::getVariableManager(state);
    VariableType::VariableType(&local_d0,samplerCubeCount,1);
    pVVar6 = VariableManager::allocate(pVVar5,&local_d0);
    VariableType::~VariableType(&local_d0);
    local_80 = pVVar6;
    pVVar5 = GeneratorState::getVariableManager(state);
    VariableManager::setStorage(pVVar5,local_80,STORAGE_UNIFORM);
    this->m_sampler = local_80;
  }
  std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::~vector
            ((vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> *)local_40);
  return;
}

Assistant:

TexLookup::TexLookup (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_type			(TYPE_LAST)
	, m_coordExpr		(DE_NULL)
	, m_lodBiasExpr		(DE_NULL)
	, m_valueType		(VariableType::TYPE_FLOAT, 4)
	, m_value			(m_valueType)
{
	DE_ASSERT(valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 4));
	DE_UNREF(valueRange); // Texture output value range is constant.

	// Select type.
	vector<Type> typeCandidates;
	if (state.getShaderParameters().useTexture2D)
	{
		typeCandidates.push_back(TYPE_TEXTURE2D);
		typeCandidates.push_back(TYPE_TEXTURE2D_LOD);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ_LOD);
	}

	if (state.getShaderParameters().useTextureCube)
	{
		typeCandidates.push_back(TYPE_TEXTURECUBE);
		typeCandidates.push_back(TYPE_TEXTURECUBE_LOD);
	}

	m_type = state.getRandom().choose<Type>(typeCandidates.begin(), typeCandidates.end());

	// Select or allocate sampler.
	VariableType::Type samplerType = VariableType::TYPE_LAST;
	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		case TYPE_TEXTURE2D_LOD:
		case TYPE_TEXTURE2D_PROJ:
		case TYPE_TEXTURE2D_PROJ_LOD:
			samplerType = VariableType::TYPE_SAMPLER_2D;
			break;

		case TYPE_TEXTURECUBE:
		case TYPE_TEXTURECUBE_LOD:
			samplerType = VariableType::TYPE_SAMPLER_CUBE;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	int		sampler2DCount		= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_2D);
	int		samplerCubeCount	= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_CUBE);
	bool	canAllocSampler		= sampler2DCount + samplerCubeCount < state.getShaderParameters().maxSamplers;
	bool	hasSampler			= samplerType == VariableType::TYPE_SAMPLER_2D ? (sampler2DCount > 0) : (samplerCubeCount > 0);
	bool	allocSampler		= !hasSampler || (canAllocSampler && state.getRandom().getBool());

	if (allocSampler)
	{
		Variable* sampler = state.getVariableManager().allocate(VariableType(samplerType, 1));
		state.getVariableManager().setStorage(sampler, Variable::STORAGE_UNIFORM); // Samplers are always uniforms.
		m_sampler = sampler;
	}
	else
		m_sampler = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin(IsSamplerEntry(samplerType)),
															    state.getVariableManager().getEnd(IsSamplerEntry(samplerType)))->getVariable();
}